

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.cpp
# Opt level: O3

void __thiscall
llvm::SmallVectorBase::grow_pod(SmallVectorBase *this,void *FirstEl,size_t MinCapacity,size_t TSize)

{
  SourceMgr *__src;
  pointer pbVar1;
  long lVar2;
  size_t in_RAX;
  void *__dest;
  char (*pacVar3) [8];
  ulong uVar4;
  char acVar5 [8];
  SMLoc IncludeLoc;
  SourceMgr *__size;
  SourceMgr *pSVar6;
  SourceMgr *pSVar7;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  aStack_e0;
  byte bStack_d0;
  Child aCStack_c8 [2];
  Child aCStack_b8 [2];
  long lStack_a8;
  ulong uStack_a0;
  SourceMgr *pSStack_98;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  aStack_90;
  ulong uStack_80;
  char acStack_78 [8];
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Stack_70;
  SourceMgr *pSStack_68;
  SourceMgr *pSStack_60;
  void *pvStack_58;
  SmallVectorBase *pSStack_50;
  ulong uStack_48;
  undefined *puStack_40;
  size_t local_38;
  
  if (MinCapacity >> 0x20 != 0) {
    puStack_40 = &UNK_00d9d734;
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar4 = (ulong)this->Capacity * 2 + 1;
  if (MinCapacity < uVar4) {
    MinCapacity = uVar4;
  }
  if (0xfffffffe < MinCapacity) {
    MinCapacity = 0xffffffff;
  }
  __src = (SourceMgr *)this->BeginX;
  __size = (SourceMgr *)(MinCapacity * TSize);
  if (__src == (SourceMgr *)FirstEl) {
    puStack_40 = (undefined *)0xd9d79a;
    pSVar6 = (SourceMgr *)FirstEl;
    pSVar7 = __size;
    local_38 = TSize;
    __dest = malloc((size_t)__size);
    if (__dest == (void *)0x0) {
      if (__size != (SourceMgr *)0x0) goto LAB_00d9d7ed;
      pSVar7 = (SourceMgr *)0x1;
      puStack_40 = (undefined *)0xd9d7ae;
      __dest = malloc(1);
      if (__dest == (void *)0x0) goto LAB_00d9d7f2;
    }
    puStack_40 = (undefined *)0xd9d7cd;
    memcpy(__dest,__src,this->Size * local_38);
LAB_00d9d7cd:
    this->BeginX = __dest;
    this->Capacity = (uint)MinCapacity;
    return;
  }
  puStack_40 = (undefined *)0xd9d770;
  pSVar6 = __size;
  pSVar7 = __src;
  local_38 = in_RAX;
  __dest = realloc(__src,(size_t)__size);
  if (__dest != (void *)0x0) goto LAB_00d9d7cd;
  if (__size == (SourceMgr *)0x0) {
    pSVar7 = (SourceMgr *)0x1;
    puStack_40 = (undefined *)0xd9d784;
    __dest = malloc(1);
    if (__dest != (void *)0x0) goto LAB_00d9d7cd;
  }
  else {
    puStack_40 = (undefined *)0xd9d7e8;
    grow_pod();
  }
  puStack_40 = (undefined *)0xd9d7ed;
  grow_pod();
LAB_00d9d7ed:
  puStack_40 = (undefined *)0xd9d7f2;
  grow_pod();
LAB_00d9d7f2:
  puStack_40 = (undefined *)0xd9d7f7;
  grow_pod();
  pSStack_68 = __size;
  pSStack_60 = __src;
  pvStack_58 = FirstEl;
  pSStack_50 = this;
  uStack_48 = MinCapacity;
  puStack_40 = &stack0xfffffffffffffff8;
  std::__cxx11::string::_M_assign((string *)TSize);
  Twine::Twine((Twine *)&aStack_90.TStorage,(string *)TSize);
  MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&aStack_e0.TStorage,(Twine *)&aStack_90.TStorage,-1,true,false);
  uVar4 = (ulong)((long)(pSVar7->IncludeDirectories).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pSVar7->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  pSStack_98 = pSVar7;
  if (((int)uVar4 != 0 & bStack_d0) == 1) {
    uVar4 = uVar4 & 0xffffffff;
    lStack_a8 = 8;
    do {
      uStack_a0 = uVar4 - 1;
      pbVar1 = (pSStack_98->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sys::path::get_separator(native);
      aCStack_c8[0].twine = (Twine *)aCStack_b8;
      lVar2 = *(long *)((long)pbVar1 + lStack_a8 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)aCStack_c8,lVar2,
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lStack_a8) + lVar2);
      std::__cxx11::string::append(&aCStack_c8[0].character);
      pacVar3 = (char (*) [8])
                std::__cxx11::string::_M_append
                          (&aCStack_c8[0].character,
                           (ulong)(pSVar6->Buffers).
                                  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      uVar4 = uStack_a0;
      acVar5 = (char  [8])(pacVar3 + 2);
      if (*pacVar3 == acVar5) {
        uStack_80 = *(ulong *)acVar5;
        acStack_78 = pacVar3[3];
        aStack_90.TStorage.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              )&uStack_80;
      }
      else {
        uStack_80 = *(ulong *)acVar5;
        aStack_90.TStorage.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              )*pacVar3;
      }
      aStack_90._8_8_ = pacVar3[1];
      *pacVar3 = acVar5;
      pacVar3[1] = (char  [8])0x0;
      pacVar3[2][0] = '\0';
      std::__cxx11::string::operator=((string *)TSize,(string *)&aStack_90.TStorage);
      if (aStack_90.TStorage.buffer !=
          (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           )&uStack_80) {
        operator_delete((void *)aStack_90.TStorage.buffer,uStack_80 + 1);
      }
      if (&(aCStack_c8[0].twine)->LHS != aCStack_b8) {
        operator_delete(aCStack_c8[0].twine,(ulong)((long)&(aCStack_b8[0].twine)->LHS + 1));
      }
      Twine::Twine((Twine *)aCStack_c8,(string *)TSize);
      MemoryBuffer::getFile
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&aStack_90.TStorage,(Twine *)aCStack_c8,-1,true,false);
      ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      moveAssign<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)&aStack_e0.TStorage,
                 (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&aStack_90.TStorage);
      if (((uStack_80 & 1) == 0) && (aStack_90.TStorage.buffer != (char  [8])0x0)) {
        (**(code **)(*(ulong *)aStack_90.TStorage.buffer + 8))();
      }
    } while ((uVar4 != 0) && (lStack_a8 = lStack_a8 + 0x20, (bStack_d0 & 1) != 0));
  }
  if ((bStack_d0 & 1) == 0) {
    _Stack_70._M_head_impl = (MemoryBuffer *)aStack_e0.TStorage.buffer;
    aStack_e0.TStorage.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
          )(char  [8])0x0;
    SourceMgr::AddNewSourceBuffer
              (pSStack_98,
               (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               &_Stack_70,IncludeLoc);
    if ((char  [8])_Stack_70._M_head_impl != (char  [8])0x0) {
      (*(_Stack_70._M_head_impl)->_vptr_MemoryBuffer[1])();
    }
    _Stack_70._M_head_impl = (MemoryBuffer *)0x0;
  }
  if (((bStack_d0 & 1) == 0) && (aStack_e0.TStorage.buffer != (char  [8])0x0)) {
    (**(code **)(*(long *)aStack_e0.TStorage.buffer + 8))();
  }
  return;
}

Assistant:

void SmallVectorBase::grow_pod(void *FirstEl, size_t MinCapacity,
                               size_t TSize) {
  // Ensure we can fit the new capacity in 32 bits.
  if (MinCapacity > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  size_t NewCapacity = 2 * capacity() + 1; // Always grow.
  NewCapacity =
      std::min(std::max(NewCapacity, MinCapacity), size_t(UINT32_MAX));

  void *NewElts;
  if (BeginX == FirstEl) {
    NewElts = safe_malloc(NewCapacity * TSize);

    // Copy the elements over.  No need to run dtors on PODs.
    memcpy(NewElts, this->BeginX, size() * TSize);
  } else {
    // If this wasn't grown from the inline copy, grow the allocated space.
    NewElts = safe_realloc(this->BeginX, NewCapacity * TSize);
  }

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}